

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O3

void __thiscall
QPixmapStyle::copyDescriptor(QPixmapStyle *this,ControlDescriptor source,ControlDescriptor dest)

{
  uchar *puVar1;
  byte bVar2;
  Entry *pEVar3;
  QArrayData *pQVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor> *this_00;
  long in_FS_OFFSET;
  QPixmapStyleDescriptor local_80;
  ControlDescriptor local_48;
  ControlDescriptor local_44;
  TryEmplaceResult local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor> *)
            (*(long *)&(this->super_QCommonStyle).super_QStyle.field_0x8 + 0xe8);
  local_48 = dest;
  local_44 = source;
  QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor>::value(&local_80,this_00,&local_44)
  ;
  QHash<QPixmapStyle::ControlDescriptor,QPixmapStyleDescriptor>::
  tryEmplace_impl<QPixmapStyle::ControlDescriptor_const&>(&local_40,this_00,&local_48);
  pEVar3 = (local_40.iterator.i.d)->spans[local_40.iterator.i.bucket >> 7].entries;
  bVar2 = (local_40.iterator.i.d)->spans[local_40.iterator.i.bucket >> 7].offsets
          [(uint)local_40.iterator.i.bucket & 0x7f];
  pQVar4 = *(QArrayData **)(pEVar3[bVar2].storage.data + 8);
  *(Data **)(pEVar3[bVar2].storage.data + 8) = local_80.fileName.d.d;
  pcVar5 = *(char16_t **)(pEVar3[bVar2].storage.data + 0x10);
  *(char16_t **)(pEVar3[bVar2].storage.data + 0x10) = local_80.fileName.d.ptr;
  qVar6 = *(qsizetype *)(pEVar3[bVar2].storage.data + 0x18);
  *(qsizetype *)(pEVar3[bVar2].storage.data + 0x18) = local_80.fileName.d.size;
  puVar1 = pEVar3[bVar2].storage.data + 0x30;
  *(undefined8 *)puVar1 = local_80.margins._8_8_;
  *(QTileRules *)(puVar1 + 8) = local_80.tileRules;
  puVar1 = pEVar3[bVar2].storage.data + 0x20;
  *(int *)puVar1 = local_80.size.wd.m_i;
  *(int *)(puVar1 + 4) = local_80.size.ht.m_i;
  *(int *)(puVar1 + 8) = local_80.margins.m_left.m_i;
  *(int *)(puVar1 + 0xc) = local_80.margins.m_top.m_i;
  local_80.fileName.d.d = (Data *)pQVar4;
  local_80.fileName.d.ptr = pcVar5;
  local_80.fileName.d.size = qVar6;
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar4,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPixmapStyle::copyDescriptor(QPixmapStyle::ControlDescriptor source,
                                  QPixmapStyle::ControlDescriptor dest)
{
    Q_D(QPixmapStyle);
    d->descriptors[dest] = d->descriptors.value(source);
}